

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O2

bool CLParser::FilterInputFilename(string *line)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  char cVar7;
  allocator<char> local_bd;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pcVar2 = (line->_M_dataplus)._M_p;
  sVar3 = line->_M_string_length;
  for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
    cVar1 = pcVar2[sVar6];
    cVar7 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar7 = cVar1;
    }
    pcVar2[sVar6] = cVar7;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,".c",&local_b9);
  bVar4 = anon_unknown.dwarf_411ac::EndsWith(line,&local_38);
  bVar5 = true;
  if (!bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,".cc",&local_ba);
    bVar4 = anon_unknown.dwarf_411ac::EndsWith(line,&local_58);
    bVar5 = true;
    if (!bVar4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,".cxx",&local_bb);
      bVar4 = anon_unknown.dwarf_411ac::EndsWith(line,&local_78);
      bVar5 = true;
      if (!bVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,".cpp",&local_bc);
        bVar4 = anon_unknown.dwarf_411ac::EndsWith(line,&local_98);
        bVar5 = true;
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,".c++",&local_bd);
          bVar5 = anon_unknown.dwarf_411ac::EndsWith(line,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return bVar5;
}

Assistant:

bool CLParser::FilterInputFilename(string line) {
  transform(line.begin(), line.end(), line.begin(), ToLowerASCII);
  // TODO: other extensions, like .asm?
  return EndsWith(line, ".c") ||
      EndsWith(line, ".cc") ||
      EndsWith(line, ".cxx") ||
      EndsWith(line, ".cpp") ||
      EndsWith(line, ".c++");
}